

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O0

void __thiscall glauber::NucleonProfile::fluctuate(NucleonProfile *this,Nucleon *nucleon)

{
  int iVar1;
  Nucleon *in_RSI;
  double *in_RDI;
  result_type_conflict rVar2;
  double dVar3;
  undefined8 uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffffd8;
  double dVar7;
  gamma_distribution<double> *in_stack_ffffffffffffffe0;
  
  rVar2 = std::gamma_distribution<double>::operator()
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar5 = 0;
  dVar3 = (rVar2 * 0.15915494309189535) / *in_RDI;
  dVar7 = in_RDI[5];
  iVar1 = Nucleon::ncoll(in_RSI);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar7;
  auVar4._0_8_ = (double)(iVar1 + -1);
  auVar4._8_8_ = uVar5;
  auVar4 = vfmadd213sd_fma(auVar4,auVar6,ZEXT816(0x3ff0000000000000));
  in_RDI[0x14] = dVar3 * auVar4._0_8_;
  return;
}

Assistant:

inline void NucleonProfile::fluctuate(const Nucleon& nucleon) {
  prefactor_ = fluct_dist_(random::engine) *
     math::double_constants::one_div_two_pi / width_sqr_ *
     (1 + alpha_*(nucleon.ncoll() - 1));
}